

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O1

PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
enqueue(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
       SPElement *element)

{
  size_t *psVar1;
  int iVar2;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar3;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar4;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar5;
  
  pLVar5 = (this->_list)._header;
  if (pLVar5 == (this->_list)._tail) {
    pLVar3 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
             operator_new(0x18);
    pLVar3->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dc98;
    (pLVar3->element).vertex = element->vertex;
    (pLVar3->element).weight = element->weight;
  }
  else {
    iVar2 = element->weight;
    pLVar3 = pLVar5->_next;
    if ((pLVar5->_next->element).weight <= iVar2) {
      do {
        pLVar5 = pLVar3;
        pLVar3 = pLVar5->_next;
        if (pLVar3 == (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0)
        goto LAB_00106bdb;
      } while ((pLVar3->element).weight <= iVar2);
      pLVar4 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
               operator_new(0x18);
      pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dc98;
      (pLVar4->element).vertex = element->vertex;
      (pLVar4->element).weight = iVar2;
      pLVar4->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
      pLVar4->_next = pLVar5->_next;
      pLVar5->_next = pLVar4;
      psVar1 = &(this->_list)._size;
      *psVar1 = *psVar1 + 1;
      if ((this->_list)._tail == pLVar5) {
        (this->_list)._tail = pLVar4;
      }
      if (pLVar3 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
        return this;
      }
LAB_00106bdb:
      pLVar5 = (this->_list)._tail;
      pLVar3 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
               operator_new(0x18);
      pLVar3->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dc98;
      (pLVar3->element).vertex = element->vertex;
      (pLVar3->element).weight = iVar2;
      pLVar3->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
      pLVar3->_next = pLVar5->_next;
      pLVar5->_next = pLVar3;
      psVar1 = &(this->_list)._size;
      *psVar1 = *psVar1 + 1;
      goto LAB_00106c55;
    }
    pLVar3 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
             operator_new(0x18);
    pLVar3->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dc98;
    (pLVar3->element).vertex = element->vertex;
    (pLVar3->element).weight = iVar2;
  }
  pLVar3->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  pLVar3->_next = pLVar5->_next;
  pLVar5->_next = pLVar3;
  psVar1 = &(this->_list)._size;
  *psVar1 = *psVar1 + 1;
  if ((this->_list)._tail != pLVar5) {
    return this;
  }
LAB_00106c55:
  (this->_list)._tail = pLVar3;
  return this;
}

Assistant:

inline
    PriorityQueue<T>& PriorityQueue<T>::enqueue(const T &element) {
        if (isEmpty()) {
            _list.insertToHeader(element);
            return *this;
        }

        if (_less(element, _list.begin()->element)) {
            _list.insertToHeader(element);
            return *this;
        }

        for (auto node = _list.begin(); node->next() != _list.end(); node = node->next()) {
            if (_less(element, node->next()->element)) {
                _list.insertAfterNode(node, element);
                return *this;
            }
        }
        _list.insertToTail(element);
        return *this;
    }